

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * Strsafe_find(char *key)

{
  uint uVar1;
  int iVar2;
  char *in_RDI;
  x1node *np;
  uint h;
  char *local_28;
  s_x1node *local_20;
  char *local_8;
  
  if (x1a == (s_x1 *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    uVar1 = strhash(in_RDI);
    local_20 = x1a->ht[uVar1 & x1a->size - 1U];
    while ((local_20 != (s_x1node *)0x0 && (iVar2 = strcmp(local_20->data,in_RDI), iVar2 != 0))) {
      local_20 = local_20->next;
    }
    if (local_20 == (s_x1node *)0x0) {
      local_28 = (char *)0x0;
    }
    else {
      local_28 = local_20->data;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

const char *Strsafe_find(const char *key)
{
  unsigned h;
  x1node *np;

  if( x1a==0 ) return 0;
  h = strhash(key) & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}